

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerlaw_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::powerlaw_dist<double>::icdf(powerlaw_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  param_type *in_RDI;
  double in_XMM0_Qa;
  result_type_conflict2 rVar2;
  double dVar3;
  undefined8 local_8;
  
  if ((in_XMM0_Qa <= 0.0) || (1.0 <= in_XMM0_Qa)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  else if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
      rVar2 = param_type::theta(in_RDI);
      dVar3 = param_type::gamma(in_RDI,1.0 - in_XMM0_Qa);
      local_8 = pow(1.0 - in_XMM0_Qa,-1.0 / dVar3);
      local_8 = rVar2 * local_8;
    }
    else {
      local_8 = std::numeric_limits<double>::infinity();
    }
  }
  else {
    local_8 = param_type::theta(in_RDI);
  }
  return local_8;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return P.theta();
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return P.theta() * math::pow(1 - x, -1 / P.gamma());
    }